

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.h
# Opt level: O0

string * __thiscall
cmGlobalNinjaMultiGenerator::BuildAlias
          (string *__return_storage_ptr__,cmGlobalNinjaMultiGenerator *this,string *alias,
          string *config)

{
  ulong uVar1;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  string *local_28;
  string *config_local;
  string *alias_local;
  cmGlobalNinjaMultiGenerator *this_local;
  
  local_28 = config;
  config_local = alias;
  alias_local = (string *)this;
  this_local = (cmGlobalNinjaMultiGenerator *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_58,config_local);
    cmAlphaNum::cmAlphaNum(&local_88,":");
    cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_58,&local_88,local_28);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)config_local);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BuildAlias(const std::string& alias,
                         const std::string& config) const override
  {
    if (config.empty()) {
      return alias;
    }
    return cmStrCat(alias, ":", config);
  }